

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

void prune_dead_connections(Curl_easy *data)

{
  conncache *pcVar1;
  Curl_share *pCVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  _Bool _Var5;
  timediff_t tVar6;
  curltime newer;
  curltime cVar7;
  curltime older;
  prunedead prune;
  Curl_easy *local_38;
  connectdata *local_30;
  
  cVar7 = Curl_now();
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  pcVar1 = (data->state).conn_cache;
  uVar3 = (pcVar1->last_cleanup).tv_sec;
  uVar4 = (pcVar1->last_cleanup).tv_usec;
  older.tv_usec = uVar4;
  older.tv_sec = uVar3;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar7._0_12_,0);
  newer.tv_usec = SUB124(cVar7._0_12_,8);
  older._12_4_ = 0;
  tVar6 = Curl_timediff(newer,older);
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
  }
  if (999 < tVar6) {
    local_30 = (connectdata *)0x0;
    local_38 = data;
    _Var5 = Curl_conncache_foreach(data,(data->state).conn_cache,&local_38,call_extract_if_dead);
    if (_Var5) {
      do {
        Curl_conncache_remove_conn(data,local_30,true);
        Curl_disconnect(data,local_30,true);
        _Var5 = Curl_conncache_foreach(data,(data->state).conn_cache,&local_38,call_extract_if_dead)
        ;
      } while (_Var5);
    }
    if (data->share == (Curl_share *)0x0) {
      pcVar1 = (data->state).conn_cache;
      (pcVar1->last_cleanup).tv_sec = cVar7.tv_sec;
      (pcVar1->last_cleanup).tv_usec = cVar7.tv_usec;
    }
    else {
      Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
      pcVar1 = (data->state).conn_cache;
      pCVar2 = data->share;
      (pcVar1->last_cleanup).tv_sec = cVar7.tv_sec;
      (pcVar1->last_cleanup).tv_usec = cVar7.tv_usec;
      if (pCVar2 != (Curl_share *)0x0) {
        Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
      }
    }
  }
  return;
}

Assistant:

static void prune_dead_connections(struct Curl_easy *data)
{
  struct curltime now = Curl_now();
  timediff_t elapsed;

  DEBUGASSERT(!data->conn); /* no connection */
  CONNCACHE_LOCK(data);
  elapsed =
    Curl_timediff(now, data->state.conn_cache->last_cleanup);
  CONNCACHE_UNLOCK(data);

  if(elapsed >= 1000L) {
    struct prunedead prune;
    prune.data = data;
    prune.extracted = NULL;
    while(Curl_conncache_foreach(data, data->state.conn_cache, &prune,
                                 call_extract_if_dead)) {
      /* unlocked */

      /* remove connection from cache */
      Curl_conncache_remove_conn(data, prune.extracted, TRUE);

      /* disconnect it */
      Curl_disconnect(data, prune.extracted, TRUE);
    }
    CONNCACHE_LOCK(data);
    data->state.conn_cache->last_cleanup = now;
    CONNCACHE_UNLOCK(data);
  }
}